

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationElementIterator::previous(CollationElementIterator *this,UErrorCode *status)

{
  char cVar1;
  short sVar2;
  uint32_t uVar3;
  int elem;
  uint uVar4;
  int elem_00;
  UVector32 *pUVar5;
  int64_t iVar6;
  uint uVar7;
  UErrorCode *pUVar8;
  CollationIterator *this_00;
  uint uVar9;
  
  uVar7 = 0xffffffff;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    cVar1 = this->dir_;
    pUVar8 = status;
    if (cVar1 < '\0') {
      uVar3 = this->otherHalf_;
      if (uVar3 != 0) {
        this->otherHalf_ = 0;
        return uVar3;
      }
    }
    else {
      if (cVar1 != '\x01') {
        if (cVar1 != '\0') {
          *status = U_INVALID_STATE_ERROR;
          return -1;
        }
        sVar2 = (this->string_).fUnion.fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          uVar9 = (this->string_).fUnion.fFields.fLength;
        }
        else {
          uVar9 = (int)sVar2 >> 5;
        }
        pUVar8 = (UErrorCode *)(ulong)uVar9;
        (*(this->iter_->super_UObject)._vptr_UObject[4])();
      }
      this->dir_ = -1;
    }
    pUVar5 = this->offsets_;
    if (pUVar5 == (UVector32 *)0x0) {
      pUVar5 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)pUVar8);
      if (pUVar5 == (UVector32 *)0x0) {
        this->offsets_ = (UVector32 *)0x0;
        *status = U_MEMORY_ALLOCATION_ERROR;
        return -1;
      }
      UVector32::UVector32(pUVar5,status);
      this->offsets_ = pUVar5;
    }
    this_00 = this->iter_;
    elem = 0;
    if ((this_00->ceBuffer).length == 0) {
      elem = (*(this_00->super_UObject)._vptr_UObject[5])();
      this_00 = this->iter_;
      pUVar5 = this->offsets_;
    }
    iVar6 = CollationIterator::previousCE(this_00,pUVar5,status);
    if (iVar6 != 0x101000100) {
      uVar4 = (uint)((ulong)iVar6 >> 0x20);
      uVar9 = (uint)((ulong)iVar6 >> 8);
      uVar7 = uVar9 & 0xff | (uint)((ulong)iVar6 >> 0x10) & 0xff00 | uVar4 & 0xffff0000;
      uVar9 = (uint)iVar6 & 0x3f | uVar9 & 0xff00 | uVar4 << 0x10;
      if (uVar9 != 0) {
        pUVar5 = this->offsets_;
        if (pUVar5->count == 0) {
          elem_00 = (*(this->iter_->super_UObject)._vptr_UObject[5])();
          UVector32::addElement(pUVar5,elem_00,status);
          UVector32::addElement(this->offsets_,elem,status);
        }
        this->otherHalf_ = uVar7;
        uVar7 = uVar9 | 0xc0;
      }
    }
  }
  return uVar7;
}

Assistant:

int32_t CollationElementIterator::previous(UErrorCode& status)
{
    if (U_FAILURE(status)) { return NULLORDER; }
    if (dir_ < 0) {
        // Continue backwards iteration. Test this first.
        if (otherHalf_ != 0) {
            uint32_t oh = otherHalf_;
            otherHalf_ = 0;
            return oh;
        }
    } else if (dir_ == 0) {
        iter_->resetToOffset(string_.length());
        dir_ = -1;
    } else if (dir_ == 1) {
        // previous() after setOffset()
        dir_ = -1;
    } else /* dir_ > 1 */ {
        // illegal change of direction
        status = U_INVALID_STATE_ERROR;
        return NULLORDER;
    }
    if (offsets_ == NULL) {
        offsets_ = new UVector32(status);
        if (offsets_ == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return NULLORDER;
        }
    }
    // If we already have expansion CEs, then we also have offsets.
    // Otherwise remember the trailing offset in case we need to
    // write offsets for an artificial expansion.
    int32_t limitOffset = iter_->getCEsLength() == 0 ? iter_->getOffset() : 0;
    int64_t ce = iter_->previousCE(*offsets_, status);
    if (ce == Collation::NO_CE) { return NULLORDER; }
    // Turn the 64-bit CE into two old-style 32-bit CEs, without quaternary bits.
    uint32_t p = (uint32_t)(ce >> 32);
    uint32_t lower32 = (uint32_t)ce;
    uint32_t firstHalf = getFirstHalf(p, lower32);
    uint32_t secondHalf = getSecondHalf(p, lower32);
    if (secondHalf != 0) {
        if (offsets_->isEmpty()) {
            // When we convert a single 64-bit CE into two 32-bit CEs,
            // we need to make this artificial expansion behave like a normal expansion.
            // See CollationIterator::previousCE().
            offsets_->addElement(iter_->getOffset(), status);
            offsets_->addElement(limitOffset, status);
        }
        otherHalf_ = firstHalf;
        return secondHalf | 0xc0;  // continuation CE
    }
    return firstHalf;
}